

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerUtil.cpp
# Opt level: O0

ByteString * DERUTIL::raw2Octet(ByteString *byteString)

{
  uchar *puVar1;
  byte *pbVar2;
  ByteString *in_RDI;
  size_t i;
  size_t value;
  size_t bytes;
  size_t len;
  ByteString header;
  size_t in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  uchar uVar3;
  ByteString *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  byte in_stack_ffffffffffffff6f;
  ulong local_68;
  ulong local_58;
  ulong local_40;
  
  ByteString::ByteString((ByteString *)0x1a4701);
  local_40 = ByteString::size((ByteString *)0x1a470e);
  if (local_40 < 0x80) {
    ByteString::resize((ByteString *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38);
    puVar1 = ByteString::operator[]
                       ((ByteString *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                        in_stack_ffffffffffffff38);
    *puVar1 = '\x04';
    in_stack_ffffffffffffff6f = (byte)local_40 & 0x7f;
    pbVar2 = ByteString::operator[]
                       ((ByteString *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                        in_stack_ffffffffffffff38);
    *pbVar2 = in_stack_ffffffffffffff6f;
  }
  else {
    local_58 = 8;
    while ((local_58 != 0 && ((local_40 >> (((byte)local_58 - 1) * '\b' & 0x3f) & 0xff) == 0))) {
      local_58 = local_58 - 1;
    }
    ByteString::resize((ByteString *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff60 =
         (ByteString *)
         ByteString::operator[]
                   ((ByteString *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                    in_stack_ffffffffffffff38);
    *(uchar *)&in_stack_ffffffffffffff60->_vptr_ByteString = '\x04';
    pbVar2 = ByteString::operator[]
                       ((ByteString *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                        in_stack_ffffffffffffff38);
    *pbVar2 = (byte)local_58 | 0x80;
    for (local_68 = 1; local_68 <= local_58; local_68 = local_68 + 1) {
      uVar3 = (byte)local_40;
      puVar1 = ByteString::operator[]
                         ((ByteString *)CONCAT17((byte)local_40,in_stack_ffffffffffffff40),
                          in_stack_ffffffffffffff38);
      *puVar1 = uVar3;
      local_40 = local_40 >> 8;
    }
  }
  operator+((ByteString *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
            in_stack_ffffffffffffff60);
  ByteString::~ByteString((ByteString *)0x1a4919);
  return in_RDI;
}

Assistant:

ByteString DERUTIL::raw2Octet(const ByteString& byteString)
{
	ByteString header;
	size_t len = byteString.size();

	// Definite, short
	if (len < 0x80)
 	{
		header.resize(2);
		header[0] = (unsigned char)0x04;
		header[1] = (unsigned char)(len & 0x7F);
	}
	// Definite, long
	else
	{
		// Count significate bytes
		size_t bytes = sizeof(size_t);
		for(; bytes > 0; bytes--)
		{
			size_t value = len >> ((bytes - 1) * 8);
			if (value & 0xFF) break;
		}

		// Set header data
		header.resize(2 + bytes);
		header[0] = (unsigned char)0x04;
		header[1] = (unsigned char)(0x80 | bytes);
		for (size_t i = 1; i <= bytes; i++)
		{
			header[2+bytes-i] = (unsigned char) (len & 0xFF);
			len >>= 8;
		}
	}

	return header + byteString;
}